

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O1

CTxOut * wallet::FindNonChangeParentOutput(CWallet *wallet,COutPoint *outpoint)

{
  pointer hash;
  element_type *peVar1;
  pointer pCVar2;
  bool bVar3;
  isminetype iVar4;
  CWalletTx **ppCVar5;
  CWalletTx *pCVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t uVar9;
  element_type *peVar10;
  COutPoint *prevout;
  long in_FS_OFFSET;
  CWalletTx *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = CWallet::GetWalletTx(wallet,(uint256 *)outpoint);
  ppCVar5 = inline_assertion_check<true,wallet::CWalletTx_const*>
                      (&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/spend.cpp"
                       ,0x1e2,"FindNonChangeParentOutput","wallet.GetWalletTx(outpoint.hash)");
  peVar10 = ((*ppCVar5)->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  uVar9 = outpoint->n;
  do {
    bVar3 = OutputIsChange(wallet,(peVar10->vout).
                                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                  super__Vector_impl_data._M_start + (int)uVar9);
    if ((!bVar3) ||
       (hash = (peVar10->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start,
       (peVar10->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_finish == hash)) break;
    pCVar6 = CWallet::GetWalletTx(wallet,(uint256 *)hash);
    if (pCVar6 == (CWalletTx *)0x0) {
LAB_0023f860:
      bVar3 = false;
    }
    else {
      peVar1 = (pCVar6->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pCVar2 = (peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = ((long)(peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar2 >> 3) * -0x3333333333333333;
      uVar7 = (ulong)(hash->prevout).n;
      if (uVar8 < uVar7 || uVar8 - uVar7 == 0) goto LAB_0023f860;
      iVar4 = CWallet::IsMine(wallet,pCVar2 + uVar7);
      if (iVar4 == ISMINE_NO) goto LAB_0023f860;
      peVar10 = (pCVar6->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      uVar9 = (hash->prevout).n;
      bVar3 = true;
    }
  } while (bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (peVar10->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start + (int)uVar9;
  }
  __stack_chk_fail();
}

Assistant:

const CTxOut& FindNonChangeParentOutput(const CWallet& wallet, const COutPoint& outpoint)
{
    AssertLockHeld(wallet.cs_wallet);
    const CWalletTx* wtx{Assert(wallet.GetWalletTx(outpoint.hash))};

    const CTransaction* ptx = wtx->tx.get();
    int n = outpoint.n;
    while (OutputIsChange(wallet, ptx->vout[n]) && ptx->vin.size() > 0) {
        const COutPoint& prevout = ptx->vin[0].prevout;
        const CWalletTx* it = wallet.GetWalletTx(prevout.hash);
        if (!it || it->tx->vout.size() <= prevout.n ||
            !wallet.IsMine(it->tx->vout[prevout.n])) {
            break;
        }
        ptx = it->tx.get();
        n = prevout.n;
    }
    return ptx->vout[n];
}